

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# length.cpp
# Opt level: O3

void duckdb::ListLengthFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong count;
  data_ptr_t pdVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  sel_t *psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  ulong uVar8;
  bool bVar9;
  reference vector;
  TemplatedValidityData<unsigned_long> *pTVar10;
  _Head_base<0UL,_unsigned_long_*,_false> _Var11;
  data_ptr_t pdVar12;
  data_ptr_t pdVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  idx_t idx_in_entry;
  ulong uVar17;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  buffer_ptr<ValidityBuffer> *local_90;
  DataChunk *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  count = args->count;
  local_88 = args;
  if (vector->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar1 = result->data;
    pdVar12 = vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    puVar2 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar2 == (unsigned_long *)0x0) {
      if (count != 0) {
        pdVar12 = pdVar12 + 8;
        uVar17 = 0;
        do {
          *(undefined8 *)(pdVar1 + uVar17 * 8) = *(undefined8 *)pdVar12;
          uVar17 = uVar17 + 1;
          pdVar12 = pdVar12 + 0x10;
        } while (count != uVar17);
      }
    }
    else {
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar2;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if (0x3f < count + 0x3f) {
        puVar2 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        uVar14 = 0;
        uVar17 = 0;
        do {
          if (puVar2 == (unsigned_long *)0x0) {
            uVar15 = uVar14 + 0x40;
            if (count <= uVar14 + 0x40) {
              uVar15 = count;
            }
LAB_014cd283:
            uVar8 = uVar14;
            if (uVar14 < uVar15) {
              pdVar13 = pdVar12 + uVar14 * 0x10 + 8;
              do {
                *(undefined8 *)(pdVar1 + uVar14 * 8) = *(undefined8 *)pdVar13;
                uVar14 = uVar14 + 1;
                pdVar13 = pdVar13 + 0x10;
                uVar8 = uVar15;
              } while (uVar15 != uVar14);
            }
          }
          else {
            uVar3 = puVar2[uVar17];
            uVar15 = uVar14 + 0x40;
            if (count <= uVar14 + 0x40) {
              uVar15 = count;
            }
            uVar8 = uVar15;
            if (uVar3 != 0) {
              if (uVar3 == 0xffffffffffffffff) goto LAB_014cd283;
              uVar8 = uVar14;
              if (uVar14 < uVar15) {
                pdVar13 = pdVar12 + uVar14 * 0x10 + 8;
                uVar16 = 0;
                do {
                  if ((uVar3 >> (uVar16 & 0x3f) & 1) != 0) {
                    *(undefined8 *)(pdVar1 + uVar16 * 8 + uVar14 * 8) = *(undefined8 *)pdVar13;
                  }
                  uVar16 = uVar16 + 1;
                  pdVar13 = pdVar13 + 0x10;
                  uVar8 = uVar15;
                } while (uVar15 - uVar14 != uVar16);
              }
            }
          }
          uVar14 = uVar8;
          uVar17 = uVar17 + 1;
        } while (uVar17 != count + 0x3f >> 6);
      }
    }
  }
  else if (vector->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    pdVar1 = result->data;
    pdVar12 = vector->data;
    puVar2 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) {
      ConstantVector::SetNull(result,false);
      *(undefined8 *)pdVar1 = *(undefined8 *)(pdVar12 + 8);
    }
    else {
      ConstantVector::SetNull(result,true);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(vector,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar1 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar4 = (local_78.sel)->sel_vector;
        uVar17 = 0;
        do {
          uVar14 = uVar17;
          if (psVar4 != (sel_t *)0x0) {
            uVar14 = (ulong)psVar4[uVar17];
          }
          *(undefined8 *)(pdVar1 + uVar17 * 8) = *(undefined8 *)(local_78.data + uVar14 * 0x10 + 8);
          uVar17 = uVar17 + 1;
        } while (count != uVar17);
      }
    }
    else if (count != 0) {
      psVar4 = (local_78.sel)->sel_vector;
      local_90 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      uVar17 = 0;
      do {
        uVar14 = uVar17;
        if (psVar4 != (sel_t *)0x0) {
          uVar14 = (ulong)psVar4[uVar17];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar14 >> 6]
             >> (uVar14 & 0x3f) & 1) == 0) {
          _Var11._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (_Var11._M_head_impl == (unsigned_long *)0x0) {
            local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_a8,&local_80);
            p_Var7 = p_Stack_a0;
            peVar6 = local_a8;
            local_a8 = (element_type *)0x0;
            p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar6;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var7;
            if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
               p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
            }
            pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_90);
            _Var11._M_head_impl =
                 (pTVar10->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var11._M_head_impl;
          }
          bVar5 = (byte)uVar17 & 0x3f;
          _Var11._M_head_impl[uVar17 >> 6] =
               _Var11._M_head_impl[uVar17 >> 6] &
               (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
        }
        else {
          *(undefined8 *)(pdVar1 + uVar17 * 8) = *(undefined8 *)(local_78.data + uVar14 * 0x10 + 8);
        }
        uVar17 = uVar17 + 1;
      } while (count != uVar17);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  bVar9 = DataChunk::AllConstant(local_88);
  if (bVar9) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  return;
}

Assistant:

static void ListLengthFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &input = args.data[0];
	D_ASSERT(input.GetType().id() == LogicalTypeId::LIST);
	UnaryExecutor::Execute<list_entry_t, int64_t>(
	    input, result, args.size(), [](list_entry_t input) { return UnsafeNumericCast<int64_t>(input.length); });
	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}